

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall Liby::TcpServer::handleErroEvent(TcpServer *this)

{
  _Manager_type p_Var1;
  
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
             (pointer)0x0);
  p_Var1 = (this->acceptorCallback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->acceptorCallback_,(_Any_data *)&this->acceptorCallback_,
              __destroy_functor);
    (this->acceptorCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->acceptorCallback_)._M_invoker = (_Invoker_type)0x0;
  }
  p_Var1 = (this->readEventCallback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->readEventCallback_,(_Any_data *)&this->readEventCallback_,
              __destroy_functor);
    (this->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
  }
  p_Var1 = (this->erroEventCallback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->erroEventCallback_,(_Any_data *)&this->erroEventCallback_,
              __destroy_functor);
    (this->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

void TcpServer::handleErroEvent() {
    chan_.reset();
    acceptorCallback_ = nullptr;
    readEventCallback_ = nullptr;
    erroEventCallback_ = nullptr;
}